

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O3

void __thiscall duckdb::HistogramBinState<bool>::Destroy(HistogramBinState<bool> *this)

{
  _Bvector_base<std::allocator<bool>_> *this_00;
  unsafe_vector<idx_t> *puVar1;
  pointer puVar2;
  
  this_00 = (_Bvector_base<std::allocator<bool>_> *)this->bin_boundaries;
  if (this_00 != (_Bvector_base<std::allocator<bool>_> *)0x0) {
    ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate(this_00);
    operator_delete(this_00);
    this->bin_boundaries = (unsafe_vector<bool> *)0x0;
  }
  puVar1 = this->counts;
  if (puVar1 != (unsafe_vector<idx_t> *)0x0) {
    puVar2 = (puVar1->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2);
    }
    operator_delete(puVar1);
    this->counts = (unsafe_vector<idx_t> *)0x0;
  }
  return;
}

Assistant:

void Destroy() {
		if (bin_boundaries) {
			delete bin_boundaries;
			bin_boundaries = nullptr;
		}
		if (counts) {
			delete counts;
			counts = nullptr;
		}
	}